

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_Extensions_Test::TestBody
          (GeneratedMessageReflectionTest_Extensions_Test *this)

{
  Descriptor *base_descriptor;
  TestAllExtensions message;
  ReflectionTester reflection_tester;
  TestAllExtensions TStack_b8;
  ReflectionTester local_88;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&TStack_b8);
  base_descriptor = proto2_unittest::TestAllExtensions::GetDescriptor();
  TestUtil::ReflectionTester::ReflectionTester(&local_88,base_descriptor);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&local_88,&TStack_b8.super_Message);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&TStack_b8);
  TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection(&local_88,&TStack_b8.super_Message);
  TestUtil::ReflectionTester::ModifyRepeatedFieldsViaReflection(&local_88,&TStack_b8.super_Message);
  TestUtil::ExpectRepeatedExtensionsModified<proto2_unittest::TestAllExtensions>(&TStack_b8);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&TStack_b8);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, Extensions) {
  // Set every extension to a unique value then go back and check all those
  // values.
  unittest::TestAllExtensions message;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllExtensions::descriptor());

  reflection_tester.SetAllFieldsViaReflection(&message);
  TestUtil::ExpectAllExtensionsSet(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(message);

  reflection_tester.ModifyRepeatedFieldsViaReflection(&message);
  TestUtil::ExpectRepeatedExtensionsModified(message);
}